

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::visitExport(PrintSExpression *this,Export *curr)

{
  ostream *poVar1;
  Name *this_00;
  char *in_RCX;
  string_view str;
  string local_208 [32];
  string_view local_1e8;
  ostream *local_1c8;
  char *pcStack_1c0;
  stringstream local_1b0 [8];
  stringstream escaped;
  String local_1a0 [376];
  string_view local_28;
  Export *local_18;
  Export *curr_local;
  PrintSExpression *this_local;
  
  local_18 = curr;
  curr_local = (Export *)this;
  std::operator<<(this->o,'(');
  poVar1 = this->o;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"export ");
  printMedium(poVar1,local_28);
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1c8 = (ostream *)(local_18->name).super_IString.str._M_len;
  pcStack_1c0 = (local_18->name).super_IString.str._M_str;
  str._M_str = in_RCX;
  str._M_len = (size_t)pcStack_1c0;
  String::printEscaped(local_1a0,local_1c8,str);
  poVar1 = this->o;
  std::__cxx11::stringstream::str();
  local_1e8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_208);
  poVar1 = printText(poVar1,local_1e8,false);
  std::operator<<(poVar1," (");
  std::__cxx11::string::~string(local_208);
  switch(local_18->kind) {
  case Function:
    std::operator<<(this->o,"func");
    break;
  case Table:
    std::operator<<(this->o,"table");
    break;
  case Memory:
    std::operator<<(this->o,"memory");
    break;
  case Global:
    std::operator<<(this->o,"global");
    break;
  case Tag:
    std::operator<<(this->o,"tag");
    break;
  case Invalid:
    handle_unreachable("invalid ExternalKind",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                       ,0xc0f);
  }
  std::operator<<(this->o,' ');
  this_00 = Export::getInternalName(local_18);
  poVar1 = wasm::Name::print(this_00,this->o);
  std::operator<<(poVar1,"))");
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void PrintSExpression::visitExport(Export* curr) {
  o << '(';
  printMedium(o, "export ");
  std::stringstream escaped;
  String::printEscaped(escaped, curr->name.str);
  printText(o, escaped.str(), false) << " (";
  switch (curr->kind) {
    case ExternalKind::Function:
      o << "func";
      break;
    case ExternalKind::Table:
      o << "table";
      break;
    case ExternalKind::Memory:
      o << "memory";
      break;
    case ExternalKind::Global:
      o << "global";
      break;
    case ExternalKind::Tag:
      o << "tag";
      break;
    case ExternalKind::Invalid:
      WASM_UNREACHABLE("invalid ExternalKind");
  }
  o << ' ';
  // TODO: specific case for type exports
  curr->getInternalName()->print(o) << "))";
}